

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O0

void __thiscall Lodtalk::VMContext::executeDoIt(VMContext *this,string *code)

{
  anon_class_8_1_898a5aeb local_40;
  WithInterpreterBlock local_38;
  string *local_18;
  string *code_local;
  VMContext *this_local;
  
  local_40.code = code;
  local_18 = code;
  code_local = (string *)this;
  std::function<void(Lodtalk::InterpreterProxy*)>::
  function<Lodtalk::VMContext::executeDoIt(std::__cxx11::string_const&)::__0,void>
            ((function<void(Lodtalk::InterpreterProxy*)> *)&local_38,&local_40);
  withInterpreter(this,&local_38);
  std::function<void_(Lodtalk::InterpreterProxy_*)>::~function(&local_38);
  return;
}

Assistant:

void VMContext::executeDoIt(const std::string &code)
{
    withInterpreter([&](InterpreterProxy *interpreter) {
        Lodtalk::executeDoIt(interpreter, code);
    });
}